

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

boolean place_niche(level *lev,mkroom *aroom,int *dy,int *xx,int *yy)

{
  int iVar1;
  bool local_35;
  byte local_34;
  byte local_33;
  coord local_32;
  int *piStack_30;
  coord dd;
  int *yy_local;
  int *xx_local;
  int *dy_local;
  mkroom *aroom_local;
  level *lev_local;
  
  piStack_30 = yy;
  iVar1 = rn2(2);
  if (iVar1 == 0) {
    *dy = -1;
    finddpos(lev,&local_32,aroom->lx,aroom->ly + -1,aroom->hx,aroom->ly + -1);
  }
  else {
    *dy = 1;
    finddpos(lev,&local_32,aroom->lx,aroom->hy + '\x01',aroom->hx,aroom->hy + '\x01');
  }
  *xx = (int)local_32.x;
  *piStack_30 = (int)local_32.y;
  local_33 = 0;
  if ((((0 < *xx) && (local_33 = 0, *xx < 0x50)) && (local_33 = 0, -1 < *piStack_30 + *dy)) &&
     ((local_33 = 0, *piStack_30 + *dy < 0x15 &&
      (local_33 = 0, lev->locations[*xx][*piStack_30 + *dy].typ == '\0')))) {
    local_34 = 0;
    if ((((0 < *xx) && ((local_34 = 0, *xx < 0x50 && (local_34 = 0, -1 < *piStack_30 - *dy)))) &&
        (local_34 = 0, *piStack_30 - *dy < 0x15)) &&
       ((lev->locations[*xx][*piStack_30 - *dy].typ < '\x11' ||
        (local_34 = 0, '\x14' < lev->locations[*xx][*piStack_30 - *dy].typ)))) {
      local_35 = false;
      if ('\x19' < lev->locations[*xx][*piStack_30 - *dy].typ) {
        local_35 = lev->locations[*xx][*piStack_30 - *dy].typ < '\"';
      }
      local_34 = local_35 ^ 0xff;
    }
    local_33 = local_34;
  }
  return local_33 & 1;
}

Assistant:

static boolean place_niche(struct level *lev, struct mkroom *aroom,
			   int *dy, int *xx, int *yy)
{
	coord dd;

	if (rn2(2)) {
	    *dy = 1;
	    finddpos(lev, &dd, aroom->lx, aroom->hy+1, aroom->hx, aroom->hy+1);
	} else {
	    *dy = -1;
	    finddpos(lev, &dd, aroom->lx, aroom->ly-1, aroom->hx, aroom->ly-1);
	}
	*xx = dd.x;
	*yy = dd.y;
	return((boolean)((isok(*xx,*yy+*dy) && lev->locations[*xx][*yy+*dy].typ == STONE)
	    && (isok(*xx,*yy-*dy) && !IS_POOL(lev->locations[*xx][*yy-*dy].typ)
				  && !IS_FURNITURE(lev->locations[*xx][*yy-*dy].typ))));
}